

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

void * mz_zip_reader_extract_file_to_heap
                 (mz_zip_archive *pZip,char *pFilename,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  void *pvVar2;
  mz_uint32 file_index;
  mz_uint local_1c;
  
  mVar1 = mz_zip_reader_locate_file_v2(pZip,pFilename,(char *)0x0,flags,&local_1c);
  if (mVar1 == 0) {
    if (pSize != (size_t *)0x0) {
      *pSize = 0;
    }
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = mz_zip_reader_extract_to_heap(pZip,local_1c,pSize,flags);
  }
  return pvVar2;
}

Assistant:

void *mz_zip_reader_extract_file_to_heap(mz_zip_archive *pZip, const char *pFilename, size_t *pSize, mz_uint flags)
{
    mz_uint32 file_index;
    if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags, &file_index))
    {
        if (pSize)
            *pSize = 0;
        return MZ_FALSE;
    }
    return mz_zip_reader_extract_to_heap(pZip, file_index, pSize, flags);
}